

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_controller.cpp
# Opt level: O3

int __thiscall so_5::stats::impl::std_controller_t::remove(std_controller_t *this,char *__filename)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_data_lock);
  if (iVar1 == 0) {
    repository_t::source_list_remove((source_t *)__filename,&this->m_head,&this->m_tail);
    iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&this->m_data_lock);
    return iVar1;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void
std_controller_t::remove( source_t & what )
	{
		std::lock_guard< std::mutex > lock{ m_data_lock };

		source_list_remove( what, m_head, m_tail );
	}